

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumCheckerboardTexture::Evaluate
          (SpectrumCheckerboardTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  array<float,_4> aVar3;
  float a;
  undefined1 auVar4 [64];
  undefined1 auVar11 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float a_00;
  undefined1 auVar18 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  anon_class_16_2_278d1f37 func;
  anon_class_16_2_278d1f37 func_00;
  anon_class_16_2_278d1f37 func_01;
  anon_class_16_2_278d1f37 func_02;
  SampledSpectrum SVar19;
  ulong uStack_d0;
  SampledWavelengths local_c8;
  TaggedPointer<pbrt::TransformMapping3D> local_a8;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_a0;
  TextureEvalContext local_98;
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  undefined1 extraout_var [56];
  
  local_a0.bits =
       (this->map2D).
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       .bits;
  local_a8.bits = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  auVar4._0_8_ = Checkerboard(this->aaMethod,ctx,(TextureMapping2DHandle *)&local_a0,
                              (TextureMapping3DHandle *)&local_a8);
  auVar4._8_56_ = extraout_var;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  a = auVar4._0_4_;
  uVar2 = auVar1._8_8_;
  a_00 = auVar1._0_4_;
  local_98._0_16_ = ctx._0_16_;
  auVar1 = (undefined1  [16])local_98._0_16_;
  local_c8.lambda = lambda.lambda.values;
  aVar3.values = local_c8.lambda.values;
  if ((a != 0.0) || (NAN(a))) {
    if ((a_00 != 0.0) || (NAN(a_00))) {
      local_98.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_98.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_98.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
           ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
           ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
           ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      local_98.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      local_98.dudx = ctx.dudx;
      local_98.dudy = ctx.dudy;
      local_98.dvdx = ctx.dvdx;
      local_98.dvdy = ctx.dvdy;
      local_98.faceIndex = ctx.faceIndex;
      local_c8.lambda.values[0] = lambda.lambda.values[0];
      local_c8.lambda.values[1] = lambda.lambda.values[1];
      local_c8.lambda.values[2] = lambda.lambda.values[2];
      local_c8.lambda.values[3] = lambda.lambda.values[3];
      local_c8.pdf.values[0] = lambda.pdf.values[0];
      local_c8.pdf.values[1] = lambda.pdf.values[1];
      local_c8.pdf.values[2] = lambda.pdf.values[2];
      local_c8.pdf.values[3] = lambda.pdf.values[3];
      auVar11 = ZEXT856((ulong)lambda.lambda.values._8_8_);
      auVar18 = ZEXT856(uVar2);
      func_01.lambda = &local_c8;
      func_01.ctx = &local_98;
      SVar19 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               ::
               Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                           *)this->tex,func_01);
      auVar14._0_8_ = SVar19.values.values._8_8_;
      auVar14._8_56_ = auVar18;
      auVar7._0_8_ = SVar19.values.values._0_8_;
      auVar7._8_56_ = auVar11;
      local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
      uStack_d0 = extraout_var._0_8_;
      auVar11 = ZEXT856(uStack_d0);
      SVar19 = SampledSpectrum::operator*(&local_50,a);
      auVar15._0_8_ = SVar19.values.values._8_8_;
      auVar15._8_56_ = auVar18;
      auVar8._0_8_ = SVar19.values.values._0_8_;
      auVar8._8_56_ = auVar11;
      local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar15._0_16_);
      local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
           ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
           ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
           ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      local_98.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      local_98.dudx = ctx.dudx;
      local_98.dudy = ctx.dudy;
      local_98.dvdx = ctx.dvdx;
      local_98.dvdy = ctx.dvdy;
      local_98.faceIndex = ctx.faceIndex;
      local_c8.pdf.values[0] = lambda.pdf.values[0];
      local_c8.pdf.values[1] = lambda.pdf.values[1];
      local_c8.pdf.values[2] = lambda.pdf.values[2];
      local_c8.pdf.values[3] = lambda.pdf.values[3];
      auVar11 = ZEXT856((ulong)lambda.lambda.values._8_8_);
      auVar18 = ZEXT856(auVar18._0_8_);
      func_02.lambda = &local_c8;
      func_02.ctx = &local_98;
      local_c8.lambda.values = aVar3.values;
      local_98._0_16_ = auVar1;
      SVar19 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               ::
               Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                           *)(this->tex + 1),func_02);
      auVar16._0_8_ = SVar19.values.values._8_8_;
      auVar16._8_56_ = auVar18;
      auVar9._0_8_ = SVar19.values.values._0_8_;
      auVar9._8_56_ = auVar11;
      local_c8.lambda.values = (float  [4])vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
      auVar11 = ZEXT856(uVar2);
      SVar19 = SampledSpectrum::operator*((SampledSpectrum *)&local_c8,a_00);
      auVar17._0_8_ = SVar19.values.values._8_8_;
      auVar17._8_56_ = auVar18;
      auVar10._0_8_ = SVar19.values.values._0_8_;
      auVar10._8_56_ = auVar11;
      local_98._0_16_ = vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
      SVar19 = SampledSpectrum::operator+(&local_40,(SampledSpectrum *)&local_98);
      return (array<float,_4>)SVar19.values.values;
    }
    local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_98.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_98.dudx = ctx.dudx;
    local_98.dudy = ctx.dudy;
    local_98.dvdx = ctx.dvdx;
    local_98.dvdy = ctx.dvdy;
    local_98.faceIndex = ctx.faceIndex;
    local_c8.pdf.values[0] = lambda.pdf.values[0];
    local_c8.pdf.values[1] = lambda.pdf.values[1];
    local_c8.pdf.values[2] = lambda.pdf.values[2];
    local_c8.pdf.values[3] = lambda.pdf.values[3];
    auVar11 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    auVar18 = ZEXT856(uVar2);
    func_00.lambda = &local_c8;
    func_00.ctx = &local_98;
    SVar19 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
             ::
             Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                         *)this->tex,func_00);
    auVar13._0_8_ = SVar19.values.values._8_8_;
    auVar13._8_56_ = auVar18;
    auVar6._0_8_ = SVar19.values.values._0_8_;
    auVar6._8_56_ = auVar11;
    local_98._0_16_ = vmovlhps_avx(auVar6._0_16_,auVar13._0_16_);
  }
  else {
    local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_98.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_98.dudx = ctx.dudx;
    local_98.dudy = ctx.dudy;
    local_98.dvdx = ctx.dvdx;
    local_98.dvdy = ctx.dvdy;
    local_98.faceIndex = ctx.faceIndex;
    local_c8.pdf.values[0] = lambda.pdf.values[0];
    local_c8.pdf.values[1] = lambda.pdf.values[1];
    local_c8.pdf.values[2] = lambda.pdf.values[2];
    local_c8.pdf.values[3] = lambda.pdf.values[3];
    auVar11 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    auVar18 = ZEXT856(uVar2);
    func.lambda = &local_c8;
    func.ctx = &local_98;
    SVar19 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
             ::
             Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                         *)(this->tex + 1),func);
    auVar12._0_8_ = SVar19.values.values._8_8_;
    auVar12._8_56_ = auVar18;
    auVar5._0_8_ = SVar19.values.values._0_8_;
    auVar5._8_56_ = auVar11;
    local_98._0_16_ = vmovlhps_avx(auVar5._0_16_,auVar12._0_16_);
    a = a_00;
  }
  SVar19 = SampledSpectrum::operator*((SampledSpectrum *)&local_98,a);
  return (array<float,_4>)(array<float,_4>)SVar19;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx, lambda);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx, lambda);
        else
            return wt[0] * tex[0].Evaluate(ctx, lambda) +
                   wt[1] * tex[1].Evaluate(ctx, lambda);
    }